

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Job.h
# Opt level: O2

void __thiscall xmrig::Job::Job(Job *this,Job *other)

{
  EVP_PKEY_CTX *src;
  
  this->m_extraIters = 0;
  (this->m_seed).m_data = (char *)0x0;
  (this->m_seed).m_size = 0;
  this->m_size = 0;
  (this->m_clientId).m_data = (char *)0x0;
  (this->m_clientId).m_size = 0;
  (this->m_extraNonce).m_data = (char *)0x0;
  (this->m_extraNonce).m_size = 0;
  (this->m_id).m_data = (char *)0x0;
  (this->m_id).m_size = 0;
  (this->m_poolWallet).m_data = (char *)0x0;
  *(undefined8 *)((long)&(this->m_poolWallet).m_data + 4) = 0;
  *(undefined8 *)((long)&(this->m_poolWallet).m_size + 4) = 0;
  memset(&this->m_diff,0,0x99);
  copy(this,(EVP_PKEY_CTX *)other,src);
  return;
}

Assistant:

inline Job(const Job &other)        { copy(other); }